

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uciengine.cpp
# Opt level: O0

void __thiscall banksia::UciEngine::newGame(UciEngine *this)

{
  ulong uVar1;
  size_t __n;
  void *__buf;
  Engine *in_RDI;
  allocator local_29;
  string local_28 [40];
  
  *(PieceType *)((long)&in_RDI[1].super_Player.name.field_2 + 0xc) =
       MoveFull::illegalMove.super_Move.promotion;
  __n = MoveFull::illegalMove.super_Move._0_8_;
  *(undefined8 *)((long)&in_RDI[1].super_Player.name.field_2 + 4) =
       MoveFull::illegalMove.super_Move._0_8_;
  in_RDI[1].super_Player.name.field_2._M_local_buf[0] = '\0';
  in_RDI->computingState = idle;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"ucinewgame",&local_29);
  uVar1 = Engine::write(in_RDI,(int)local_28,__buf,__n);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  if ((uVar1 & 1) != 0) {
    Player::setState(&in_RDI->super_Player,playing);
  }
  return;
}

Assistant:

void UciEngine::newGame()
{
    assert(getState() == PlayerState::ready);
    ponderingMove = MoveFull::illegalMove;
    expectingBestmove = false;
    computingState = EngineComputingState::idle;
    if (write("ucinewgame")) {
        setState(PlayerState::playing);
    }
}